

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O0

bool __thiscall UnifiedRegex::CharBitvec::IsSubsetOf(CharBitvec *this,CharBitvec *other)

{
  int local_24;
  uint32 v;
  int w;
  CharBitvec *other_local;
  CharBitvec *this_local;
  
  local_24 = 0;
  while( true ) {
    if (7 < local_24) {
      return true;
    }
    if (other->vec[local_24] != (this->vec[local_24] | other->vec[local_24])) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

inline bool IsSubsetOf(const CharBitvec& other) const
        {
            for (int w = 0; w < vecSize; w++)
            {
                uint32 v = other.vec[w];
                if (v != (vec[w] | v))
                {
                    return false;
                }
            }
            return true;
        }